

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O0

serial_ptr<char> * __thiscall
BCL::
serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
::operator()(serial_ptr<char> *__return_storage_ptr__,
            serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
            *this,string *string)

{
  element_type eVar1;
  size_t sVar2;
  char *__p;
  ulong uVar3;
  element_type *peVar4;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  undefined1 local_21;
  string *local_20;
  string *string_local;
  serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
  *this_local;
  serial_ptr<char> *ptr;
  
  local_21 = 0;
  local_20 = string;
  string_local = (string *)this;
  this_local = (serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
                *)__return_storage_ptr__;
  serial_ptr<char>::serial_ptr(__return_storage_ptr__);
  sVar2 = std::__cxx11::string::length();
  __return_storage_ptr__->N = sVar2;
  __p = (char *)operator_new__(__return_storage_ptr__->N);
  std::shared_ptr<char>::shared_ptr<char,void>((shared_ptr<char> *)local_38,__p);
  std::shared_ptr<char>::operator=(&__return_storage_ptr__->ptr,(shared_ptr<char> *)local_38);
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)local_38);
  for (local_3c = 0; uVar3 = std::__cxx11::string::length(), (ulong)(long)local_3c < uVar3;
      local_3c = local_3c + 1) {
    peVar4 = (element_type *)std::__cxx11::string::operator[]((ulong)local_20);
    eVar1 = *peVar4;
    peVar4 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__);
    peVar4[local_3c] = eVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

serial_ptr <char> operator()(const std::string &string) const noexcept {
      serial_ptr <char> ptr;
      ptr.N = string.length();
      ptr.ptr = std::shared_ptr <char> (new char[ptr.N]);

      for (int i = 0; i < string.length(); i++) {
        ptr.ptr.get()[i] = string[i];
      }

      return ptr;
    }